

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_compute_branch1(DisasContext_conflict6 *ctx,uint32_t op,int32_t cc,int32_t offset)

{
  TCGContext_conflict6 *tcg_ctx;
  target_ulong tVar1;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  TCGv_i32 pTVar2;
  int32_t iVar3;
  uint uVar4;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx);
  if (((ctx->insn_flags & 0x2000) != 0) && ((ctx->hflags & 0x87f800) != 0)) {
LAB_00886c13:
    generate_exception_end(ctx,0x14);
    goto LAB_00886f84;
  }
  if (cc != 0) {
    check_insn(ctx,0x28);
  }
  tVar1 = (ctx->base).pc_next;
  if (op == 0x45410000) {
    ret_00 = tcg_temp_new_i32(tcg_ctx);
    iVar3 = 0x17;
    if (cc != 0) {
      iVar3 = cc + 0x18;
    }
    tcg_gen_shri_i32_mips64el(tcg_ctx,ret,tcg_ctx->fpu_fcr31,iVar3);
    tcg_gen_shri_i32_mips64el(tcg_ctx,ret_00,tcg_ctx->fpu_fcr31,cc + 0x19);
    tcg_gen_or_i32(tcg_ctx,ret,ret,ret_00);
    tcg_gen_shri_i32_mips64el(tcg_ctx,ret_00,tcg_ctx->fpu_fcr31,cc + 0x1a);
    tcg_gen_or_i32(tcg_ctx,ret,ret,ret_00);
    pTVar2 = tcg_ctx->fpu_fcr31;
    iVar3 = cc + 0x1b;
LAB_00886f0c:
    tcg_gen_shri_i32_mips64el(tcg_ctx,ret_00,pTVar2,iVar3);
    tcg_gen_or_i32(tcg_ctx,ret,ret,ret_00);
LAB_00886f2b:
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
LAB_00886f39:
    uVar4 = 0x1000;
  }
  else {
    if (op == 0x45010000) {
      iVar3 = 0x17;
      if (cc != 0) {
        iVar3 = cc + 0x18;
      }
      tcg_gen_shri_i32_mips64el(tcg_ctx,ret,tcg_ctx->fpu_fcr31,iVar3);
      goto LAB_00886f39;
    }
    if (op == 0x45020000) {
      iVar3 = 0x17;
      if (cc != 0) {
        iVar3 = cc + 0x18;
      }
      tcg_gen_shri_i32_mips64el(tcg_ctx,ret,tcg_ctx->fpu_fcr31,iVar3);
      tcg_gen_not_i32(tcg_ctx,ret,ret);
    }
    else {
      if (op != 0x45030000) {
        if (op == 0x45200000) {
          ret_00 = tcg_temp_new_i32(tcg_ctx);
          iVar3 = 0x17;
          if (cc != 0) {
            iVar3 = cc + 0x18;
          }
          tcg_gen_shri_i32_mips64el(tcg_ctx,ret,tcg_ctx->fpu_fcr31,iVar3);
          pTVar2 = tcg_ctx->fpu_fcr31;
          iVar3 = cc + 0x19;
        }
        else {
          if (op == 0x45210000) {
            ret_00 = tcg_temp_new_i32(tcg_ctx);
            iVar3 = 0x17;
            if (cc != 0) {
              iVar3 = cc + 0x18;
            }
            tcg_gen_shri_i32_mips64el(tcg_ctx,ret,tcg_ctx->fpu_fcr31,iVar3);
            pTVar2 = tcg_ctx->fpu_fcr31;
            iVar3 = cc + 0x19;
            goto LAB_00886f0c;
          }
          if (op != 0x45400000) {
            if (op != 0x45000000) goto LAB_00886c13;
            iVar3 = 0x17;
            if (cc != 0) {
              iVar3 = cc + 0x18;
            }
            tcg_gen_shri_i32_mips64el(tcg_ctx,ret,tcg_ctx->fpu_fcr31,iVar3);
            tcg_gen_not_i32(tcg_ctx,ret,ret);
            goto LAB_00886f39;
          }
          ret_00 = tcg_temp_new_i32(tcg_ctx);
          iVar3 = 0x17;
          if (cc != 0) {
            iVar3 = cc + 0x18;
          }
          tcg_gen_shri_i32_mips64el(tcg_ctx,ret,tcg_ctx->fpu_fcr31,iVar3);
          tcg_gen_shri_i32_mips64el(tcg_ctx,ret_00,tcg_ctx->fpu_fcr31,cc + 0x19);
          tcg_gen_and_i32(tcg_ctx,ret,ret,ret_00);
          tcg_gen_shri_i32_mips64el(tcg_ctx,ret_00,tcg_ctx->fpu_fcr31,cc + 0x1a);
          tcg_gen_and_i32(tcg_ctx,ret,ret,ret_00);
          pTVar2 = tcg_ctx->fpu_fcr31;
          iVar3 = cc + 0x1b;
        }
        tcg_gen_shri_i32_mips64el(tcg_ctx,ret_00,pTVar2,iVar3);
        tcg_gen_nand_i32_mips64el(tcg_ctx,ret,ret,ret_00);
        goto LAB_00886f2b;
      }
      iVar3 = 0x17;
      if (cc != 0) {
        iVar3 = cc + 0x18;
      }
      tcg_gen_shri_i32_mips64el(tcg_ctx,ret,tcg_ctx->fpu_fcr31,iVar3);
    }
    uVar4 = 0x1800;
  }
  tcg_gen_andi_i32_mips64el(tcg_ctx,ret,ret,1);
  tcg_gen_extu_i32_i64_mips64el(tcg_ctx,tcg_ctx->bcond,ret);
  ctx->btarget = (long)offset + tVar1 + 4;
  ctx->hflags = uVar4 | ctx->hflags | 0x10000;
LAB_00886f84:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_compute_branch1(DisasContext *ctx, uint32_t op,
                                int32_t cc, int32_t offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong btarget;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);

    if ((ctx->insn_flags & ISA_MIPS32R6) && (ctx->hflags & MIPS_HFLAG_BMASK)) {
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

    if (cc != 0) {
        check_insn(ctx, ISA_MIPS4 | ISA_MIPS32);
    }

    btarget = ctx->base.pc_next + 4 + offset;

    switch (op) {
    case OPC_BC1F:
        tcg_gen_shri_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, get_fp_bit(cc));
        tcg_gen_not_i32(tcg_ctx, t0, t0);
        tcg_gen_andi_i32(tcg_ctx, t0, t0, 1);
        tcg_gen_extu_i32_tl(tcg_ctx, tcg_ctx->bcond, t0);
        goto not_likely;
    case OPC_BC1FL:
        tcg_gen_shri_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, get_fp_bit(cc));
        tcg_gen_not_i32(tcg_ctx, t0, t0);
        tcg_gen_andi_i32(tcg_ctx, t0, t0, 1);
        tcg_gen_extu_i32_tl(tcg_ctx, tcg_ctx->bcond, t0);
        goto likely;
    case OPC_BC1T:
        tcg_gen_shri_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, get_fp_bit(cc));
        tcg_gen_andi_i32(tcg_ctx, t0, t0, 1);
        tcg_gen_extu_i32_tl(tcg_ctx, tcg_ctx->bcond, t0);
        goto not_likely;
    case OPC_BC1TL:
        tcg_gen_shri_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, get_fp_bit(cc));
        tcg_gen_andi_i32(tcg_ctx, t0, t0, 1);
        tcg_gen_extu_i32_tl(tcg_ctx, tcg_ctx->bcond, t0);
    likely:
        ctx->hflags |= MIPS_HFLAG_BL;
        break;
    case OPC_BC1FANY2:
        {
            TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_shri_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, get_fp_bit(cc));
            tcg_gen_shri_i32(tcg_ctx, t1, tcg_ctx->fpu_fcr31, get_fp_bit(cc + 1));
            tcg_gen_nand_i32(tcg_ctx, t0, t0, t1);
            tcg_temp_free_i32(tcg_ctx, t1);
            tcg_gen_andi_i32(tcg_ctx, t0, t0, 1);
            tcg_gen_extu_i32_tl(tcg_ctx, tcg_ctx->bcond, t0);
        }
        goto not_likely;
    case OPC_BC1TANY2:
        {
            TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_shri_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, get_fp_bit(cc));
            tcg_gen_shri_i32(tcg_ctx, t1, tcg_ctx->fpu_fcr31, get_fp_bit(cc + 1));
            tcg_gen_or_i32(tcg_ctx, t0, t0, t1);
            tcg_temp_free_i32(tcg_ctx, t1);
            tcg_gen_andi_i32(tcg_ctx, t0, t0, 1);
            tcg_gen_extu_i32_tl(tcg_ctx, tcg_ctx->bcond, t0);
        }
        goto not_likely;
    case OPC_BC1FANY4:
        {
            TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_shri_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, get_fp_bit(cc));
            tcg_gen_shri_i32(tcg_ctx, t1, tcg_ctx->fpu_fcr31, get_fp_bit(cc + 1));
            tcg_gen_and_i32(tcg_ctx, t0, t0, t1);
            tcg_gen_shri_i32(tcg_ctx, t1, tcg_ctx->fpu_fcr31, get_fp_bit(cc + 2));
            tcg_gen_and_i32(tcg_ctx, t0, t0, t1);
            tcg_gen_shri_i32(tcg_ctx, t1, tcg_ctx->fpu_fcr31, get_fp_bit(cc + 3));
            tcg_gen_nand_i32(tcg_ctx, t0, t0, t1);
            tcg_temp_free_i32(tcg_ctx, t1);
            tcg_gen_andi_i32(tcg_ctx, t0, t0, 1);
            tcg_gen_extu_i32_tl(tcg_ctx, tcg_ctx->bcond, t0);
        }
        goto not_likely;
    case OPC_BC1TANY4:
        {
            TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_shri_i32(tcg_ctx, t0, tcg_ctx->fpu_fcr31, get_fp_bit(cc));
            tcg_gen_shri_i32(tcg_ctx, t1, tcg_ctx->fpu_fcr31, get_fp_bit(cc + 1));
            tcg_gen_or_i32(tcg_ctx, t0, t0, t1);
            tcg_gen_shri_i32(tcg_ctx, t1, tcg_ctx->fpu_fcr31, get_fp_bit(cc + 2));
            tcg_gen_or_i32(tcg_ctx, t0, t0, t1);
            tcg_gen_shri_i32(tcg_ctx, t1, tcg_ctx->fpu_fcr31, get_fp_bit(cc + 3));
            tcg_gen_or_i32(tcg_ctx, t0, t0, t1);
            tcg_temp_free_i32(tcg_ctx, t1);
            tcg_gen_andi_i32(tcg_ctx, t0, t0, 1);
            tcg_gen_extu_i32_tl(tcg_ctx, tcg_ctx->bcond, t0);
        }
    not_likely:
        ctx->hflags |= MIPS_HFLAG_BC;
        break;
    default:
        MIPS_INVAL("cp1 cond branch");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }
    ctx->btarget = btarget;
    ctx->hflags |= MIPS_HFLAG_BDS32;
 out:
    tcg_temp_free_i32(tcg_ctx, t0);
}